

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

void __thiscall Shell::parseAssertReturn(Shell *this,Element *s)

{
  Literals LVar1;
  Literals LVar2;
  bool bVar3;
  long lVar4;
  mapped_type *pmVar5;
  Element *pEVar6;
  ostream *poVar7;
  stringstream in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd49;
  Literal in_stack_fffffffffffffd50;
  pointer in_stack_fffffffffffffd68;
  pointer pLVar8;
  pointer pLVar9;
  pointer in_stack_fffffffffffffd70;
  pointer pLVar10;
  pointer pLVar11;
  pointer in_stack_fffffffffffffd78;
  pointer pLVar12;
  pointer pLVar13;
  Literal local_128;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_110;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_f8;
  size_t local_e0;
  Literal local_d8;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_c0;
  SmallVector<wasm::Literal,_1UL> local_a8;
  SmallVector<wasm::Literal,_1UL> local_68;
  
  local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.fixed._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  local_68.fixed._M_elems[0].type.id = 0;
  local_68.usedFixed = 0;
  local_68.fixed._M_elems[0].field_0.i64 = 0;
  local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fixed._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  local_a8.fixed._M_elems[0].type.id = 0;
  local_a8.usedFixed = 0;
  local_a8.fixed._M_elems[0].field_0.i64 = 0;
  lVar4 = wasm::Element::list();
  pLVar8 = in_stack_fffffffffffffd68;
  pLVar10 = in_stack_fffffffffffffd70;
  pLVar12 = in_stack_fffffffffffffd78;
  if (2 < *(ulong *)(lVar4 + 8)) {
    pmVar5 = std::
             map<wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>_>
             ::operator[](&this->builders,&this->lastModule);
    pEVar6 = (Element *)
             (pmVar5->super___shared_ptr<wasm::SExpressionWasmBuilder,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    wasm::Element::operator[]((uint)s);
    wasm::SExpressionWasmBuilder::parseExpression(pEVar6);
    wasm::getLiteralsFromConstExpression((Expression *)&stack0xfffffffffffffd48);
    local_a8.usedFixed = CONCAT71(in_stack_fffffffffffffd49,in_stack_fffffffffffffd48);
    wasm::Literal::operator=(local_a8.fixed._M_elems,(Literal *)&stack0xfffffffffffffd50);
    local_f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
         .super__Vector_impl_data._M_finish;
    pLVar8 = (pointer)0x0;
    pLVar10 = (pointer)0x0;
    pLVar12 = (pointer)0x0;
    local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffd68;
    local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffffd70;
    local_a8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd78;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_f8);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xfffffffffffffd68);
    wasm::Literal::~Literal((Literal *)&stack0xfffffffffffffd50);
  }
  pEVar6 = (Element *)wasm::Element::operator[]((uint)s);
  parseOperation((Literals *)&stack0xfffffffffffffd48,this,pEVar6);
  local_68.usedFixed = CONCAT71(in_stack_fffffffffffffd49,in_stack_fffffffffffffd48);
  wasm::Literal::operator=(local_68.fixed._M_elems,(Literal *)&stack0xfffffffffffffd50);
  local_f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pLVar9 = (pointer)0x0;
  pLVar11 = (pointer)0x0;
  pLVar13 = (pointer)0x0;
  local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = pLVar8;
  local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar10;
  local_68.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pLVar12;
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_f8);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xfffffffffffffd68);
  wasm::Literal::~Literal((Literal *)&stack0xfffffffffffffd50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"seen ",5);
  local_e0 = local_68.usedFixed;
  wasm::Literal::Literal(&local_d8,local_68.fixed._M_elems);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector(&local_c0,&local_68.flexible);
  LVar1.super_SmallVector<wasm::Literal,_1UL>.usedFixed._1_7_ = in_stack_fffffffffffffd49;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.usedFixed._0_1_ = in_stack_fffffffffffffd48;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0 =
       in_stack_fffffffffffffd50.field_0;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       in_stack_fffffffffffffd50.type.id;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = pLVar9;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = pLVar11;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pLVar13;
  poVar7 = (ostream *)wasm::operator<<((ostream *)&std::cerr,LVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", expected ",0xb);
  wasm::Literal::Literal(&local_128,local_a8.fixed._M_elems);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector(&local_110,&local_a8.flexible);
  LVar2.super_SmallVector<wasm::Literal,_1UL>.usedFixed._1_7_ = in_stack_fffffffffffffd49;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.usedFixed._0_1_ = in_stack_fffffffffffffd48;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0 =
       in_stack_fffffffffffffd50.field_0;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       in_stack_fffffffffffffd50.type.id;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = pLVar9;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = pLVar11;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pLVar13;
  poVar7 = (ostream *)wasm::operator<<(poVar7,LVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&stack0xfffffffffffffd48,1);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_110);
  wasm::Literal::~Literal(&local_128);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_c0);
  wasm::Literal::~Literal(&local_d8);
  bVar3 = wasm::SmallVector<wasm::Literal,_1UL>::operator==(&local_a8,&local_68);
  if (bVar3) {
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_a8.flexible);
    wasm::Literal::~Literal(local_a8.fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_68.flexible);
    wasm::Literal::~Literal(local_68.fixed._M_elems);
    return;
  }
  wasm::Fatal::Fatal((Fatal *)&stack0xfffffffffffffd48);
  wasm::Fatal::operator<<
            ((Fatal *)&stack0xfffffffffffffd48,(char (*) [33])"unexpected, should be identical\n");
  wasm::Fatal::~Fatal((Fatal *)&stack0xfffffffffffffd48);
}

Assistant:

void parseAssertReturn(Element& s) {
    Literals actual;
    Literals expected;
    if (s.size() >= 3) {
      expected = getLiteralsFromConstExpression(
        builders[lastModule]->parseExpression(*s[2]));
    }
    [[maybe_unused]] bool trapped = false;
    try {
      actual = parseOperation(*s[1]);
    } catch (const TrapException&) {
      trapped = true;
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      trapped = true;
    }
    assert(!trapped);
    std::cerr << "seen " << actual << ", expected " << expected << '\n';
    if (expected != actual) {
      Fatal() << "unexpected, should be identical\n";
    }
  }